

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall t_c_glib_generator::generate_xception(t_c_glib_generator *this,t_struct *tstruct)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  string local_128;
  string local_108;
  undefined1 local_e8 [8];
  string name_uc;
  undefined1 local_a8 [8];
  string name_lc;
  string local_78;
  undefined1 local_58 [8];
  string name_u;
  string name;
  t_struct *tstruct_local;
  t_c_glib_generator *this_local;
  
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string
            ((string *)(name_u.field_2._M_local_buf + 8),(string *)CONCAT44(extraout_var,iVar1));
  std::__cxx11::string::string((string *)&local_78,(string *)(name_u.field_2._M_local_buf + 8));
  initial_caps_to_underscores((string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)(name_uc.field_2._M_local_buf + 8),(string *)local_58);
  to_lower_case((string *)local_a8,(string *)((long)&name_uc.field_2 + 8));
  std::__cxx11::string::~string((string *)(name_uc.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_108,(string *)local_58);
  to_upper_case((string *)local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  generate_object(this,tstruct);
  poVar2 = std::operator<<((ostream *)&this->f_types_,"/* exception */");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"typedef enum");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)&this->f_types_,(string *)&local_128);
  poVar2 = std::operator<<(poVar2,(string *)&this->nspace_uc);
  poVar2 = std::operator<<(poVar2,(string *)local_e8);
  poVar2 = std::operator<<(poVar2,"_ERROR_CODE");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_128);
  t_generator::indent_down((t_generator *)this);
  poVar2 = std::operator<<((ostream *)&this->f_types_,"} ");
  poVar2 = std::operator<<(poVar2,(string *)&this->nspace);
  poVar2 = std::operator<<(poVar2,(string *)(name_u.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,"Error;");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"GQuark ");
  poVar2 = std::operator<<(poVar2,(string *)&this->nspace_lc);
  poVar2 = std::operator<<(poVar2,(string *)local_a8);
  poVar2 = std::operator<<(poVar2,"_error_quark (void);");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"#define ");
  poVar2 = std::operator<<(poVar2,(string *)&this->nspace_uc);
  poVar2 = std::operator<<(poVar2,(string *)local_e8);
  poVar2 = std::operator<<(poVar2,"_ERROR (");
  poVar2 = std::operator<<(poVar2,(string *)&this->nspace_lc);
  poVar2 = std::operator<<(poVar2,(string *)local_a8);
  poVar2 = std::operator<<(poVar2,"_error_quark())");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)&this->f_types_impl_,
                           "/* define the GError domain for exceptions */");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"#define ");
  poVar2 = std::operator<<(poVar2,(string *)&this->nspace_uc);
  poVar2 = std::operator<<(poVar2,(string *)local_e8);
  poVar2 = std::operator<<(poVar2,"_ERROR_DOMAIN \"");
  poVar2 = std::operator<<(poVar2,(string *)&this->nspace_lc);
  poVar2 = std::operator<<(poVar2,(string *)local_a8);
  poVar2 = std::operator<<(poVar2,"_error_quark\"");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"GQuark");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,(string *)&this->nspace_lc);
  poVar2 = std::operator<<(poVar2,(string *)local_a8);
  poVar2 = std::operator<<(poVar2,"_error_quark (void)");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"{");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"  return g_quark_from_static_string (");
  poVar2 = std::operator<<(poVar2,(string *)&this->nspace_uc);
  poVar2 = std::operator<<(poVar2,(string *)local_e8);
  poVar2 = std::operator<<(poVar2,"_ERROR_DOMAIN);");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(name_u.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_c_glib_generator::generate_xception(t_struct* tstruct) {
  string name = tstruct->get_name();
  string name_u = initial_caps_to_underscores(name);
  string name_lc = to_lower_case(name_u);
  string name_uc = to_upper_case(name_u);

  generate_object(tstruct);

  f_types_ << "/* exception */" << endl
           << "typedef enum" << endl
           << "{" << endl;
  indent_up();
  f_types_ << indent() << this->nspace_uc << name_uc << "_ERROR_CODE" << endl;
  indent_down();
  f_types_ << "} " << this->nspace << name << "Error;" << endl
           << endl
           << "GQuark " << this->nspace_lc << name_lc
           << "_error_quark (void);" << endl
           << "#define " << this->nspace_uc << name_uc << "_ERROR ("
           << this->nspace_lc << name_lc << "_error_quark())" << endl
           << endl
           << endl;

  f_types_impl_ << "/* define the GError domain for exceptions */" << endl << "#define "
                << this->nspace_uc << name_uc << "_ERROR_DOMAIN \"" << this->nspace_lc << name_lc
                << "_error_quark\"" << endl << "GQuark" << endl << this->nspace_lc << name_lc
                << "_error_quark (void)" << endl << "{" << endl
                << "  return g_quark_from_static_string (" << this->nspace_uc << name_uc
                << "_ERROR_DOMAIN);" << endl << "}" << endl << endl;
}